

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ConstPixelBufferAccess *pCVar1;
  CubeFace face;
  deUint32 value;
  int iVar2;
  int iVar3;
  char *__s;
  int *piVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  Vector<int,_2> (*arr) [5];
  int (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  int (*arr_02) [5];
  int (*arr_03) [5];
  bool bVar7;
  int *local_c70;
  Vector<int,_3> *local_c58;
  MessageBuilder local_c20;
  MessageBuilder local_aa0;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  MessageBuilder local_880;
  MessageBuilder local_700;
  MessageBuilder local_580;
  MessageBuilder local_400;
  int local_27c;
  int local_278;
  int i_1;
  int currentAtomicValueNdx;
  int failingNdx;
  undefined1 local_260 [8];
  IVec3 gid;
  IVec2 pixCoord;
  int i;
  IVec2 pixelCoords [5];
  undefined1 local_218 [8];
  IVec3 invocationGlobalIDs [5];
  int iStack_1d4;
  int compareArgs [5];
  Functional local_1b8 [4];
  undefined4 uStack_1b4;
  int returnValues [5];
  int x;
  int y;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  LogImage local_c0;
  int local_2c;
  ConstPixelBufferAccess *pCStack_28;
  int sliceOrFaceNdx_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  ReturnValueVerifier *this_local;
  
  local_2c = sliceOrFaceNdx;
  pCStack_28 = resultSlice;
  resultSlice_local = (ConstPixelBufferAccess *)log;
  log_local = (TestLog *)this;
  de::toString<int>(&local_100,&local_2c);
  std::operator+(&local_e0,"ReturnValues",&local_100);
  local_172 = 0;
  local_173 = 0;
  bVar7 = this->m_imageType != TEXTURETYPE_CUBE;
  if (bVar7) {
    de::toString<int>((string *)&y,&local_2c);
    std::operator+(&local_150,"slice ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
  }
  else {
    face = glslImageFuncZToCubeFace(local_2c);
    value = cubeFaceToGLFace(face);
    __s = glu::getCubeMapFaceName(value);
    std::allocator<char>::allocator();
    local_172 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__s,&local_171);
    local_173 = 1;
    std::operator+(&local_150,"face ",&local_170);
  }
  std::operator+(&local_130,"Per-Invocation Return Values, ",&local_150);
  tcu::LogImage::LogImage(&local_c0,&local_e0,&local_130,pCStack_28,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(log,&local_c0);
  tcu::LogImage::~LogImage(&local_c0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  if (bVar7) {
    std::__cxx11::string::~string((string *)&y);
  }
  if ((local_173 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_170);
  }
  if ((local_172 & 1) != 0) {
    std::allocator<char>::~allocator(&local_171);
  }
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  returnValues[4] = 0;
  do {
    iVar3 = returnValues[4];
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(pCStack_28);
    if (iVar2 <= iVar3) {
      return true;
    }
    for (returnValues[3] = 0; returnValues[3] < this->m_endResultImageWidth;
        returnValues[3] = returnValues[3] + 1) {
      local_c58 = (Vector<int,_3> *)local_218;
      do {
        tcu::Vector<int,_3>::Vector(local_c58);
        local_c58 = local_c58 + 1;
      } while (local_c58 != (Vector<int,_3> *)(invocationGlobalIDs[4].m_data + 1));
      local_c70 = pixCoord.m_data + 1;
      do {
        tcu::Vector<int,_2>::Vector((Vector<int,_2> *)local_c70);
        local_c70 = local_c70 + 2;
      } while ((IVec2 *)local_c70 != pixelCoords + 4);
      for (pixCoord.m_data[0] = 0; pixCoord.m_data[0] < 5;
          pixCoord.m_data[0] = pixCoord.m_data[0] + 1) {
        tcu::Vector<int,_2>::Vector
                  ((Vector<int,_2> *)(gid.m_data + 1),
                   returnValues[3] + pixCoord.m_data[0] * this->m_endResultImageWidth,
                   returnValues[4]);
        iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(gid.m_data + 1));
        iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(gid.m_data + 1));
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_260,iVar3,iVar2,local_2c);
        *(undefined8 *)((&pixCoord)[pixCoord.m_data[0]].m_data + 1) = gid.m_data._4_8_;
        *(undefined1 (*) [8])(invocationGlobalIDs[(long)pixCoord.m_data[0] + -1].m_data + 1) =
             local_260;
        invocationGlobalIDs[pixCoord.m_data[0]].m_data[0] = gid.m_data[0];
        pCVar1 = pCStack_28;
        iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_260);
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&currentAtomicValueNdx,(int)pCVar1,iVar3,
                   returnValues[4]);
        piVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&currentAtomicValueNdx);
        *(int *)(local_1b8 + (long)pixCoord.m_data[0] * 4) = *piVar4;
        iVar3 = getCompareArg((IVec3 *)local_260,this->m_endResultImageWidth);
        invocationGlobalIDs[4].m_data[(long)pixCoord.m_data[0] + 2] = iVar3;
      }
      i_1 = -1;
      local_278 = 0;
      for (local_27c = 0; local_27c < 5; local_27c = local_27c + 1) {
        if (*(int *)(local_1b8 + (long)local_27c * 4) !=
            invocationGlobalIDs[4].m_data[(long)local_278 + 2]) {
          if ((local_27c < 1) ||
             (*(int *)(local_1b8 + (long)local_27c * 4) !=
              invocationGlobalIDs[4].m_data[(long)(local_278 + 1) + 2])) {
            i_1 = local_27c;
            break;
          }
          local_278 = local_278 + 1;
        }
      }
      if (-1 < i_1) {
        tcu::TestLog::operator<<
                  (&local_880,(TestLog *)resultSlice_local,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_880,
                            (char (*) [50])"// Failure: intermediate return values at pixels ");
        arrayStr<tcu::Vector<int,2>,5>(&local_8a0,(Functional *)(pixCoord.m_data + 1),arr);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8a0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [23])" of current layer are ");
        arrayStr<int,5>(&local_8c0,local_1b8,arr_00);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8c0);
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_700,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_700,
                            (char (*) [52])"// Note: relevant shader invocation global IDs are ");
        arrayStr<tcu::Vector<int,3>,5>(&local_8e0,(Functional *)local_218,arr_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8e0);
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_580,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_580,
                            (char (*) [52])"// Note: \'compare\' argument values for the IDs are ");
        arrayStr<int,5>(&local_900,(Functional *)(invocationGlobalIDs[4].m_data + 2),arr_02);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_900);
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_400,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_400,
                            (char (*) [82])
                            "// Note: expected the return value sequence to fulfill the following conditions:\n"
                           );
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])"// - first value is ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,invocationGlobalIDs[4].m_data + 2);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [123])
                                   "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
                           );
        arrayStr<int,5>(&local_920,(Functional *)(invocationGlobalIDs[4].m_data + 2),arr_03);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_920);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [37])") bigger than the one just before it");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_920);
        tcu::MessageBuilder::~MessageBuilder(&local_400);
        std::__cxx11::string::~string((string *)&local_900);
        tcu::MessageBuilder::~MessageBuilder(&local_580);
        std::__cxx11::string::~string((string *)&local_8e0);
        tcu::MessageBuilder::~MessageBuilder(&local_700);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::__cxx11::string::~string((string *)&local_8a0);
        tcu::MessageBuilder::~MessageBuilder(&local_880);
        if (i_1 == 0) {
          tcu::TestLog::operator<<
                    (&local_aa0,(TestLog *)resultSlice_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_aa0,(char (*) [34])"// Note: the first return value (");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)local_1b8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])") isn\'t ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,invocationGlobalIDs[4].m_data + 2);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_aa0);
        }
        else {
          tcu::TestLog::operator<<
                    (&local_c20,(TestLog *)resultSlice_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_c20,(char (*) [36])"// Note: the return value at index ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&i_1);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])" (value ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(local_1b8 + (long)i_1 * 4));
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b47c71);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"is neither ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(local_1b8 + (long)(i_1 + -1) * 4))
          ;
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [27])" (the one just before it) ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])"nor ");
          iVar3 = arrayIndexOf<int,5>((int (*) [5])(invocationGlobalIDs[4].m_data + 2),
                                      (int *)(local_1b8 + (long)(i_1 + -1) * 4));
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,invocationGlobalIDs[4].m_data + (long)(iVar3 + 1) + 2);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [57])
                                     " (the smallest value bigger than the one just before it)");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_c20);
        }
        return false;
      }
    }
    returnValues[4] = returnValues[4] + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == NUM_INVOCATIONS_PER_PIXEL*m_endResultImageWidth);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < m_endResultImageWidth; x++)
		{
			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			int		returnValues[NUM_INVOCATIONS_PER_PIXEL];
			int		compareArgs[NUM_INVOCATIONS_PER_PIXEL];
			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2	pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageWidth, y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				pixelCoords[i]			= pixCoord;
				invocationGlobalIDs[i]	= gid;
				returnValues[i]			= resultSlice.getPixelInt(gid.x(), y).x();
				compareArgs[i]			= getCompareArg(gid, m_endResultImageWidth);
			}

			// Verify that the return values form a valid sequence.
			// Due to the way the compare and assign arguments to the atomic calls are organized
			// among the different invocations contributing to the same pixel -- i.e. one invocation
			// compares to A and assigns B, another compares to B and assigns C, and so on, where
			// A<B<C etc -- the first value in the return value sequence must be A, and each following
			// value must be either the same as or the smallest value (among A, B, C, ...) bigger than
			// the one just before it. E.g. sequences A A A A A A A A, A B C D E F G H and
			// A A B B B C D E are all valid sequences (if there were 8 invocations contributing
			// to each pixel).

			{
				int failingNdx = -1;

				{
					int currentAtomicValueNdx = 0;
					for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					{
						if (returnValues[i] == compareArgs[currentAtomicValueNdx])
							continue;
						if (i > 0 && returnValues[i] == compareArgs[currentAtomicValueNdx+1])
						{
							currentAtomicValueNdx++;
							continue;
						}
						failingNdx = i;
						break;
					}
				}

				if (failingNdx >= 0)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< arrayStr(returnValues) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: 'compare' argument values for the IDs are " << arrayStr(compareArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected the return value sequence to fulfill the following conditions:\n"
											<< "// - first value is " << compareArgs[0] << "\n"
											<< "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
											<< arrayStr(compareArgs) << ") bigger than the one just before it" << TestLog::EndMessage;
					if (failingNdx == 0)
						log << TestLog::Message << "// Note: the first return value (" << returnValues[0] << ") isn't " << compareArgs[0] << TestLog::EndMessage;
					else
						log << TestLog::Message << "// Note: the return value at index " << failingNdx << " (value " << returnValues[failingNdx] << ") "
												<< "is neither " << returnValues[failingNdx-1] << " (the one just before it) "
												<< "nor " << compareArgs[arrayIndexOf(compareArgs, returnValues[failingNdx-1])+1] << " (the smallest value bigger than the one just before it)"
												<< TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}